

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonlinear_beamformer.cc
# Opt level: O2

void __thiscall
webrtc::NonlinearBeamformer::NonlinearBeamformer
          (NonlinearBeamformer *this,
          vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
          *array_geometry,SphericalPointf target_direction)

{
  undefined8 *puVar1;
  ulong uVar2;
  size_t dim;
  long lVar3;
  float *pfVar4;
  ulong uVar5;
  float *pfVar6;
  bool bVar7;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  float fVar8;
  Optional<webrtc::CartesianPoint<float>_> OVar9;
  _Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
  local_68;
  undefined1 local_48 [16];
  
  local_48._8_4_ = in_XMM0_Dc;
  local_48._0_8_ = target_direction.s._0_8_;
  local_48._12_4_ = in_XMM0_Dd;
  (this->super_Beamformer<float>)._vptr_Beamformer =
       (_func_int **)&PTR__NonlinearBeamformer_001d4470;
  (this->super_Callback)._vptr_Callback = (_func_int **)&PTR__NonlinearBeamformer_001d44c0;
  (this->lapped_transform_)._M_t.
  super___uniq_ptr_impl<webrtc::LappedTransform,_std::default_delete<webrtc::LappedTransform>_>._M_t
  .super__Tuple_impl<0UL,_webrtc::LappedTransform_*,_std::default_delete<webrtc::LappedTransform>_>.
  super__Head_base<0UL,_webrtc::LappedTransform_*,_false>._M_head_impl = (LappedTransform *)0x0;
  this->num_input_channels_ =
       ((long)(array_geometry->
              super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
              )._M_impl.super__Vector_impl_data._M_finish -
       (long)(array_geometry->
             super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
             )._M_impl.super__Vector_impl_data._M_start) / 0xc;
  std::vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>::
  vector((vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_> *)
         &local_68,array_geometry);
  uVar2 = ((long)local_68._M_impl.super__Vector_impl_data._M_finish -
          (long)local_68._M_impl.super__Vector_impl_data._M_start) / 0xc;
  lVar3 = 0;
  pfVar4 = (local_68._M_impl.super__Vector_impl_data._M_start)->c;
  for (; lVar3 != 3; lVar3 = lVar3 + 1) {
    fVar8 = 0.0;
    uVar5 = uVar2;
    pfVar6 = pfVar4;
    while (bVar7 = uVar5 != 0, uVar5 = uVar5 - 1, bVar7) {
      fVar8 = fVar8 + *pfVar6;
      pfVar6 = pfVar6 + 3;
    }
    uVar5 = uVar2;
    pfVar6 = pfVar4;
    while (bVar7 = uVar5 != 0, uVar5 = uVar5 - 1, bVar7) {
      *pfVar6 = *pfVar6 - fVar8 / (float)uVar2;
      pfVar6 = pfVar6 + 3;
    }
    pfVar4 = pfVar4 + 1;
  }
  (this->array_geometry_).
  super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
  ._M_impl.super__Vector_impl_data._M_start = local_68._M_impl.super__Vector_impl_data._M_start;
  (this->array_geometry_).
  super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = local_68._M_impl.super__Vector_impl_data._M_finish;
  (this->array_geometry_).
  super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_68._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::_Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
  ::~_Vector_base(&local_68);
  OVar9 = GetArrayNormalIfExists(array_geometry);
  *(long *)(this->array_normal_).value_.c = OVar9.value_.c._0_8_;
  (this->array_normal_).value_.c[2] = OVar9.value_.c[2];
  (this->array_normal_).has_value_ = OVar9.has_value_;
  fVar8 = GetMinimumSpacing(array_geometry);
  this->min_mic_spacing_ = fVar8;
  this->target_angle_radians_ = (float)local_48._0_4_;
  (this->interf_angles_radians_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->interf_angles_radians_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->interf_angles_radians_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  fVar8 = 0.025132744 / fVar8;
  if (fVar8 <= 0.2) {
    fVar8 = 0.2;
  }
  if (3.1415927 <= fVar8) {
    fVar8 = 3.1415927;
  }
  this->away_radians_ = fVar8;
  lVar3 = 0;
  do {
    puVar1 = (undefined8 *)
             ((long)&this->delay_sum_masks_[0].super_Matrix<std::complex<float>_>.scratch_elements_.
                     super__Vector_base<std::complex<float>_*,_std::allocator<std::complex<float>_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish + lVar3);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)
             ((long)&this->delay_sum_masks_[0].super_Matrix<std::complex<float>_>.scratch_data_.
                     super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + lVar3);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)
             ((long)&this->delay_sum_masks_[0].super_Matrix<std::complex<float>_>.scratch_data_.
                     super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start + lVar3);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)
             ((long)&this->delay_sum_masks_[0].super_Matrix<std::complex<float>_>.elements_.
                     super__Vector_base<std::complex<float>_*,_std::allocator<std::complex<float>_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish + lVar3);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)
             ((long)&this->delay_sum_masks_[0].super_Matrix<std::complex<float>_>.data_.
                     super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + lVar3);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)
             ((long)&this->delay_sum_masks_[0].super_Matrix<std::complex<float>_>.data_.
                     super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start + lVar3);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)
             ((long)&this->delay_sum_masks_[0].super_Matrix<std::complex<float>_>.num_rows_ + lVar3)
    ;
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined ***)
     ((long)&this->delay_sum_masks_[0].super_Matrix<std::complex<float>_>._vptr_Matrix + lVar3) =
         &PTR__Matrix_001d4438;
    lVar3 = lVar3 + 0x78;
  } while (lVar3 != 0x3c78);
  lVar3 = 0;
  do {
    puVar1 = (undefined8 *)
             ((long)&this->normalized_delay_sum_masks_[0].super_Matrix<std::complex<float>_>.
                     scratch_elements_.
                     super__Vector_base<std::complex<float>_*,_std::allocator<std::complex<float>_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish + lVar3);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)
             ((long)&this->normalized_delay_sum_masks_[0].super_Matrix<std::complex<float>_>.
                     scratch_data_.
                     super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + lVar3);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)
             ((long)&this->normalized_delay_sum_masks_[0].super_Matrix<std::complex<float>_>.
                     scratch_data_.
                     super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start + lVar3);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)
             ((long)&this->normalized_delay_sum_masks_[0].super_Matrix<std::complex<float>_>.
                     elements_.
                     super__Vector_base<std::complex<float>_*,_std::allocator<std::complex<float>_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish + lVar3);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)
             ((long)&this->normalized_delay_sum_masks_[0].super_Matrix<std::complex<float>_>.data_.
                     super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + lVar3);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)
             ((long)&this->normalized_delay_sum_masks_[0].super_Matrix<std::complex<float>_>.data_.
                     super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start + lVar3);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)
             ((long)&this->normalized_delay_sum_masks_[0].super_Matrix<std::complex<float>_>.
                     num_rows_ + lVar3);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined ***)
     ((long)&this->normalized_delay_sum_masks_[0].super_Matrix<std::complex<float>_>._vptr_Matrix +
     lVar3) = &PTR__Matrix_001d4438;
    lVar3 = lVar3 + 0x78;
  } while (lVar3 != 0x3c78);
  lVar3 = 0;
  do {
    puVar1 = (undefined8 *)
             ((long)&this->target_cov_mats_[0].super_Matrix<std::complex<float>_>.scratch_elements_.
                     super__Vector_base<std::complex<float>_*,_std::allocator<std::complex<float>_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish + lVar3);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)
             ((long)&this->target_cov_mats_[0].super_Matrix<std::complex<float>_>.scratch_data_.
                     super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + lVar3);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)
             ((long)&this->target_cov_mats_[0].super_Matrix<std::complex<float>_>.scratch_data_.
                     super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start + lVar3);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)
             ((long)&this->target_cov_mats_[0].super_Matrix<std::complex<float>_>.elements_.
                     super__Vector_base<std::complex<float>_*,_std::allocator<std::complex<float>_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish + lVar3);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)
             ((long)&this->target_cov_mats_[0].super_Matrix<std::complex<float>_>.data_.
                     super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + lVar3);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)
             ((long)&this->target_cov_mats_[0].super_Matrix<std::complex<float>_>.data_.
                     super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start + lVar3);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)
             ((long)&this->target_cov_mats_[0].super_Matrix<std::complex<float>_>.num_rows_ + lVar3)
    ;
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined ***)
     ((long)&this->target_cov_mats_[0].super_Matrix<std::complex<float>_>._vptr_Matrix + lVar3) =
         &PTR__Matrix_001d4438;
    lVar3 = lVar3 + 0x78;
  } while (lVar3 != 0x3c78);
  lVar3 = 0;
  do {
    puVar1 = (undefined8 *)
             ((long)&this->uniform_cov_mat_[0].super_Matrix<std::complex<float>_>.scratch_elements_.
                     super__Vector_base<std::complex<float>_*,_std::allocator<std::complex<float>_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish + lVar3);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)
             ((long)&this->uniform_cov_mat_[0].super_Matrix<std::complex<float>_>.scratch_data_.
                     super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + lVar3);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)
             ((long)&this->uniform_cov_mat_[0].super_Matrix<std::complex<float>_>.scratch_data_.
                     super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start + lVar3);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)
             ((long)&this->uniform_cov_mat_[0].super_Matrix<std::complex<float>_>.elements_.
                     super__Vector_base<std::complex<float>_*,_std::allocator<std::complex<float>_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish + lVar3);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)
             ((long)&this->uniform_cov_mat_[0].super_Matrix<std::complex<float>_>.data_.
                     super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + lVar3);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)
             ((long)&this->uniform_cov_mat_[0].super_Matrix<std::complex<float>_>.data_.
                     super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start + lVar3);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)
             ((long)&this->uniform_cov_mat_[0].super_Matrix<std::complex<float>_>.num_rows_ + lVar3)
    ;
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined ***)
     ((long)&this->uniform_cov_mat_[0].super_Matrix<std::complex<float>_>._vptr_Matrix + lVar3) =
         &PTR__Matrix_001d4438;
    lVar3 = lVar3 + 0x78;
  } while (lVar3 != 0x3c78);
  memset(this->interf_cov_mats_,0,0xc18);
  memset(this->rpsiws_,0,0xc18);
  (this->eig_m_).super_Matrix<std::complex<float>_>.num_rows_ = 0;
  (this->eig_m_).super_Matrix<std::complex<float>_>.num_columns_ = 0;
  (this->eig_m_).super_Matrix<std::complex<float>_>.data_.
  super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->eig_m_).super_Matrix<std::complex<float>_>.data_.
  super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->eig_m_).super_Matrix<std::complex<float>_>.data_.
  super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->eig_m_).super_Matrix<std::complex<float>_>.elements_.
  super__Vector_base<std::complex<float>_*,_std::allocator<std::complex<float>_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->eig_m_).super_Matrix<std::complex<float>_>.elements_.
  super__Vector_base<std::complex<float>_*,_std::allocator<std::complex<float>_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->eig_m_).super_Matrix<std::complex<float>_>.elements_.
  super__Vector_base<std::complex<float>_*,_std::allocator<std::complex<float>_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->eig_m_).super_Matrix<std::complex<float>_>.scratch_data_.
  super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->eig_m_).super_Matrix<std::complex<float>_>.scratch_data_.
  super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->eig_m_).super_Matrix<std::complex<float>_>.scratch_data_.
  super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->eig_m_).super_Matrix<std::complex<float>_>.scratch_elements_.
  super__Vector_base<std::complex<float>_*,_std::allocator<std::complex<float>_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->eig_m_).super_Matrix<std::complex<float>_>.scratch_elements_.
  super__Vector_base<std::complex<float>_*,_std::allocator<std::complex<float>_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->eig_m_).super_Matrix<std::complex<float>_>.scratch_elements_.
  super__Vector_base<std::complex<float>_*,_std::allocator<std::complex<float>_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->eig_m_).super_Matrix<std::complex<float>_>._vptr_Matrix =
       (_func_int **)&PTR__Matrix_001d4438;
  WindowGenerator::KaiserBesselDerived(1.5,0x100,this->window_);
  return;
}

Assistant:

NonlinearBeamformer::NonlinearBeamformer(
    const std::vector<Point>& array_geometry,
    SphericalPointf target_direction)
    : num_input_channels_(array_geometry.size()),
      array_geometry_(GetCenteredArray(array_geometry)),
      array_normal_(GetArrayNormalIfExists(array_geometry)),
      min_mic_spacing_(GetMinimumSpacing(array_geometry)),
      target_angle_radians_(target_direction.azimuth()),
      away_radians_(std::min(
          static_cast<float>(M_PI),
          std::max(kMinAwayRadians,
                   kAwaySlope * static_cast<float>(M_PI) / min_mic_spacing_))) {
  WindowGenerator::KaiserBesselDerived(kKbdAlpha, kFftSize, window_);
}